

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::TextureMagFilterCase::testTexture
          (TextureMagFilterCase *this)

{
  TexParamVerifier *pTVar1;
  int local_20;
  int local_1c;
  int ndx_1;
  int ndx;
  GLenum magValues [2];
  TextureMagFilterCase *this_local;
  
  _ndx_1 = 0x260100002600;
  pTVar1 = (this->super_TextureCase).m_verifier;
  magValues = (GLenum  [2])this;
  (*pTVar1->_vptr_TexParamVerifier[2])
            (pTVar1,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,0x2800
             ,0x2601);
  ApiCase::expectError((ApiCase *)this,0);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_TextureCase).super_ApiCase.super_CallLogWrapper,
               (this->super_TextureCase).m_textureTarget,0x2800,(&ndx_1)[local_1c]);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar1 = (this->super_TextureCase).m_verifier;
    (*pTVar1->_vptr_TexParamVerifier[2])
              (pTVar1,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               0x2800,(ulong)(uint)(&ndx_1)[local_1c]);
    ApiCase::expectError((ApiCase *)this,0);
  }
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    glu::CallLogWrapper::glTexParameterf
              (&(this->super_TextureCase).super_ApiCase.super_CallLogWrapper,
               (this->super_TextureCase).m_textureTarget,0x2800,(float)(uint)(&ndx_1)[local_20]);
    ApiCase::expectError((ApiCase *)this,0);
    pTVar1 = (this->super_TextureCase).m_verifier;
    (*pTVar1->_vptr_TexParamVerifier[2])
              (pTVar1,(this->super_TextureCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_TextureCase).m_textureTarget,
               0x2800,(ulong)(uint)(&ndx_1)[local_20]);
    ApiCase::expectError((ApiCase *)this,0);
  }
  return;
}

Assistant:

void testTexture (void)
	{
		const GLenum magValues[] = {GL_NEAREST, GL_LINEAR};

		m_verifier->verifyInteger(m_testCtx, m_textureTarget, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(magValues); ++ndx)
		{
			glTexParameteri(m_textureTarget, GL_TEXTURE_MAG_FILTER, magValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, GL_TEXTURE_MAG_FILTER, magValues[ndx]);
			expectError(GL_NO_ERROR);
		}

		//check unit conversions with float

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(magValues); ++ndx)
		{
			glTexParameterf(m_textureTarget, GL_TEXTURE_MAG_FILTER, (GLfloat)magValues[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_textureTarget, GL_TEXTURE_MAG_FILTER, magValues[ndx]);
			expectError(GL_NO_ERROR);
		}
	}